

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

Vec_Int_t * Aig_ManPartitionMonolithic(Aig_Man_t *p)

{
  int nSize;
  Vec_Int_t *pVVar1;
  Vec_Int_t *vId2Part;
  Aig_Man_t *p_local;
  
  nSize = Aig_ManObjNumMax(p);
  pVVar1 = Vec_IntStart(nSize);
  return pVVar1;
}

Assistant:

Vec_Int_t * Aig_ManPartitionMonolithic( Aig_Man_t * p )
{
    Vec_Int_t * vId2Part;
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    return vId2Part;
}